

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.h
# Opt level: O3

void __thiscall Ptex::v2_2::PtexReader::MetaData::getValue(MetaData *this,char *key,char **value)

{
  int iVar1;
  Entry *pEVar2;
  char *pcVar3;
  int index;
  MetaDataType type;
  
  iVar1 = (*(this->super_PtexMetaData)._vptr_PtexMetaData[5])();
  if ((char)iVar1 != '\0') {
    pEVar2 = getEntry(this,-1);
    if ((pEVar2 != (Entry *)0x0) && (pEVar2->type == mdt_string)) {
      pcVar3 = pEVar2->data;
      goto LAB_001138f4;
    }
  }
  pcVar3 = (char *)0x0;
LAB_001138f4:
  *value = pcVar3;
  return;
}

Assistant:

virtual void getValue(const char* key, const char*& value)
	{
	    int index = -1;
	    MetaDataType type;
	    if (!findKey(key, index, type)) {
                value = 0;
                return;
            }
            Entry* e = getEntry(index);
	    if (e && e->type == mdt_string) value = (const char*) e->data;
	    else value = 0;
	}